

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O1

curi_status parse_path(char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData)

{
  ulong uVar1;
  size_t sVar2;
  curi_status cVar3;
  char *pcVar4;
  curi_status cVar5;
  size_t initialOffset;
  size_t initialOffset_1;
  
  uVar1 = *offset;
  pcVar4 = "";
  if (uVar1 < len) {
    pcVar4 = uri + uVar1;
  }
  *offset = uVar1 + 1;
  if (*pcVar4 != '/') {
    cVar3 = (uint)(*pcVar4 != '/') * 2;
  }
  else {
    cVar3 = parse_segment(uri,len,offset,settings,userData,1);
    if (cVar3 == curi_status_success) {
      cVar3 = parse_segments(uri,len,offset,settings,userData);
    }
    if (cVar3 == curi_status_error) {
      *offset = uVar1 + 1;
      cVar3 = curi_status_success;
    }
  }
  if (cVar3 == curi_status_success) {
    cVar3 = handle_path(uri + uVar1,*offset - uVar1,settings,userData);
  }
  if (cVar3 == curi_status_error) {
    *offset = uVar1;
    cVar3 = curi_status_error;
  }
  if (cVar3 == curi_status_error) {
    sVar2 = *offset;
    cVar3 = parse_segment(uri,len,offset,settings,userData,1);
    if (cVar3 == curi_status_success) {
      cVar3 = parse_segments(uri,len,offset,settings,userData);
    }
    if (cVar3 == curi_status_error) {
      *offset = sVar2;
      cVar3 = curi_status_success;
    }
    if (cVar3 == curi_status_success) {
      cVar3 = handle_path(uri + sVar2,*offset - sVar2,settings,userData);
    }
    if (cVar3 == curi_status_error) {
      *offset = sVar2;
      cVar3 = curi_status_error;
    }
  }
  cVar5 = curi_status_success;
  if (cVar3 != curi_status_error) {
    cVar5 = cVar3;
  }
  return cVar5;
}

Assistant:

static curi_status parse_path(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData)
{
    // path = path-absolute
    //      / path-relative
    //      / path-empty
    curi_status status = curi_status_error;

    if (status == curi_status_error)
        TRY(status,offset,parse_path_absolute(uri, len, offset, settings, userData));

    if (status == curi_status_error)
        TRY(status,offset,parse_path_relative(uri, len, offset, settings, userData));

    if (status == curi_status_error)
        TRY(status,offset,parse_path_empty(uri, len, offset, settings, userData));

    return status;
}